

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManage.cpp
# Opt level: O0

void init_module_manager(void)

{
  module_head = (ModuleStruct *)operator_new(0x30);
  module_head->id = 0xff;
  module_head->name = (char *)0x0;
  module_head->cs_seg = 0;
  module_head->ds_seg = 0;
  module_head->forward = (ModuleStruct *)0x0;
  module_head->next = (ModuleStruct *)0x0;
  module_head->funclist = (LibFuncList *)0x0;
  return;
}

Assistant:

void init_module_manager() {
	module_head = new ModuleStruct;
	module_head->id = -1;
	module_head->name = nullptr;
	module_head->cs_seg = 0;
	module_head->ds_seg = 0;
	module_head->forward = nullptr;
	module_head->next = nullptr;
	module_head->funclist = nullptr;
}